

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O1

Type * __thiscall
soul::Type::withConstAndRefFlags
          (Type *__return_storage_ptr__,Type *this,bool shouldBeConst,bool shouldBeRef)

{
  Structure *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  Type *t;
  
  CVar2 = this->arrayElementCategory;
  bVar3 = this->isRef;
  bVar4 = this->isConstant;
  __return_storage_ptr__->category = this->category;
  __return_storage_ptr__->arrayElementCategory = CVar2;
  __return_storage_ptr__->isRef = bVar3;
  __return_storage_ptr__->isConstant = bVar4;
  (__return_storage_ptr__->primitiveType).type = (this->primitiveType).type;
  BVar5 = this->arrayElementBoundingSize;
  __return_storage_ptr__->boundingSize = this->boundingSize;
  __return_storage_ptr__->arrayElementBoundingSize = BVar5;
  pSVar1 = (this->structure).object;
  (__return_storage_ptr__->structure).object = pSVar1;
  if (pSVar1 != (Structure *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  __return_storage_ptr__->isConstant = shouldBeConst;
  __return_storage_ptr__->isRef = shouldBeRef;
  return __return_storage_ptr__;
}

Assistant:

Type Type::withConstAndRefFlags (bool shouldBeConst, bool shouldBeRef) const
{
    auto t = *this;
    t.isConstant = shouldBeConst;
    t.isRef = shouldBeRef;
    return t;
}